

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_set_nodump(char *file,wchar_t line,char *pathname)

{
  uint local_34;
  int local_30;
  wchar_t flags;
  wchar_t r;
  wchar_t fd;
  char *pathname_local;
  char *pcStack_18;
  wchar_t line_local;
  char *file_local;
  
  _r = pathname;
  pathname_local._4_4_ = line;
  pcStack_18 = file;
  assertion_count(file,line);
  flags = open(_r,0x800);
  if (flags < L'\0') {
    failure_start(pcStack_18,pathname_local._4_4_,"Can\'t open %s\n",_r);
    failure_finish((void *)0x0);
    file_local._4_4_ = L'\0';
  }
  else {
    local_30 = ioctl(flags,0x80086601,&local_34);
    if (local_30 < 0) {
      failure_start(pcStack_18,pathname_local._4_4_,"Can\'t get flags %s\n",_r);
      failure_finish((void *)0x0);
      file_local._4_4_ = L'\0';
    }
    else {
      local_34 = local_34 | 0x40;
      local_30 = ioctl(flags,0x40086602,&local_34);
      if (local_30 < 0) {
        failure_start(pcStack_18,pathname_local._4_4_,"Can\'t set nodump %s\n",_r);
        failure_finish((void *)0x0);
        file_local._4_4_ = L'\0';
      }
      else {
        close(flags);
        file_local._4_4_ = L'\x01';
      }
    }
  }
  return file_local._4_4_;
}

Assistant:

int
assertion_set_nodump(const char *file, int line, const char *pathname)
{
#if defined(HAVE_STRUCT_STAT_ST_FLAGS) && defined(UF_NODUMP)
	int r;

	assertion_count(file, line);
	r = chflags(pathname, UF_NODUMP);
	if (r < 0) {
		failure_start(file, line, "Can't set nodump %s\n", pathname);
		failure_finish(NULL);
		return (0);
	}
#elif (defined(FS_IOC_GETFLAGS) && defined(HAVE_WORKING_FS_IOC_GETFLAGS) && \
       defined(FS_NODUMP_FL)) || \
      (defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS) \
	 && defined(EXT2_NODUMP_FL))
	int fd, r, flags;

	assertion_count(file, line);
	fd = open(pathname, O_RDONLY | O_NONBLOCK);
	if (fd < 0) {
		failure_start(file, line, "Can't open %s\n", pathname);
		failure_finish(NULL);
		return (0);
	}
	r = ioctl(fd,
#ifdef FS_IOC_GETFLAGS
	    FS_IOC_GETFLAGS,
#else
	    EXT2_IOC_GETFLAGS,
#endif
	    &flags);
	if (r < 0) {
		failure_start(file, line, "Can't get flags %s\n", pathname);
		failure_finish(NULL);
		return (0);
	}
#ifdef FS_NODUMP_FL
	flags |= FS_NODUMP_FL;
#else
	flags |= EXT2_NODUMP_FL;
#endif

	 r = ioctl(fd,
#ifdef FS_IOC_SETFLAGS
	    FS_IOC_SETFLAGS,
#else
	    EXT2_IOC_SETFLAGS,
#endif
	    &flags);
	if (r < 0) {
		failure_start(file, line, "Can't set nodump %s\n", pathname);
		failure_finish(NULL);
		return (0);
	}
	close(fd);
#else
	(void)pathname; /* UNUSED */
	assertion_count(file, line);
#endif
	return (1);
}